

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O2

bool LoadScriptFile(int lumpnum,FileReader *lump,int numnodes,bool include,int type)

{
  FStrifeDialogueItemCheck *pFVar1;
  int iVar2;
  FTextureID FVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  FStrifeDialogueNode *pFVar7;
  PClassActor *pPVar8;
  uint *puVar9;
  Node *pNVar10;
  PClassInventory *pPVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  FName local_650;
  char buffer [4];
  FStrifeDialogueNode *local_640;
  char fullsound [16];
  int local_61c;
  int local_618;
  int local_614;
  char local_610 [8];
  int local_608;
  char local_604 [4];
  char local_600 [12];
  undefined1 local_5f4 [8];
  char local_5ec [8];
  char local_5e4 [292];
  undefined1 local_4c0 [1168];
  
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,buffer,4);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0xfffffffffffffffc,1);
  if (((buffer[0] == '\0') || (buffer[1] == '\0')) || (buffer[2] == '\0')) {
    if (type == 2) goto LAB_003f4ce1;
  }
  else {
    if (type == 2 && buffer[3] == '\0' || type == 1 && buffer[3] != '\0') goto LAB_003f4ce1;
    if (buffer[3] != '\0') {
      P_ParseUSDF(lumpnum,lump,numnodes);
      return true;
    }
  }
  if (!include) {
    LoadScriptFile("SCRIPT00",true,1);
  }
  if (((byte)gameinfo.flags & 2) == 0) {
    iVar2 = 0x5ec;
  }
  else {
    iVar2 = 0x5d0;
  }
  if (numnodes % iVar2 == 0) {
    iVar2 = numnodes / iVar2;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    iVar12 = 0;
    for (iVar14 = 0; iVar14 != iVar2; iVar14 = iVar14 + 1) {
      if (((byte)gameinfo.flags & 2) == 0) {
        pFVar7 = (FStrifeDialogueNode *)operator_new(0x50);
        (pFVar7->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
        (pFVar7->ItemCheck).Most = 0;
        (pFVar7->ItemCheck).Count = 0;
        (pFVar7->SpeakerVoice).ID = 0;
        pFVar7->Goodbye = (char *)0x0;
        (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_61c,0x5ec);
        pPVar8 = GetStrifeType(local_61c);
        pFVar7->SpeakerType = pPVar8;
        uVar5 = StrifeDialogues.Count;
        if ((-1 < local_61c) && (iVar12 != local_61c)) {
          if (pPVar8 != (PClassActor *)0x0) {
            local_650.Index =
                 (pPVar8->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
                 Index;
            puVar9 = (uint *)TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::operator[]
                                       (&ClassRoots,&local_650);
            *puVar9 = uVar5;
          }
          uVar5 = StrifeDialogues.Count;
          pNVar10 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::GetNode
                              (&DialogueRoots,local_61c);
          (pNVar10->Pair).Value = uVar5;
          iVar12 = local_61c;
        }
        pcVar6 = ncopystring(local_5e4);
        pFVar7->Dialogue = pcVar6;
        local_5e4[0] = '\0';
        FVar3 = FTextureManager::CheckForTexture(&TexMan,local_5ec,8,1);
        (pFVar7->Backdrop).texnum = FVar3.texnum;
        local_5ec[0] = '\0';
        mysnprintf(fullsound,0x10,"svox/%s",local_5f4);
        iVar4 = S_FindSound(fullsound);
        (pFVar7->SpeakerVoice).ID = iVar4;
        local_5f4[0] = 0;
        pcVar6 = ncopystring(local_604);
        pFVar7->SpeakerName = pcVar6;
        pPVar8 = GetStrifeType(local_618);
        pPVar8 = dyn_cast<PClassActor>((DObject *)pPVar8);
        pFVar7->DropType = pPVar8;
        TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Resize(&pFVar7->ItemCheck,3);
        for (lVar13 = 0; lVar13 != 0xc; lVar13 = lVar13 + 4) {
          pPVar8 = GetStrifeType(*(int *)(local_610 + lVar13 + -4));
          pPVar11 = dyn_cast<PClassInventory>((DObject *)pPVar8);
          pFVar1 = (pFVar7->ItemCheck).Array;
          *(PClassInventory **)((long)&pFVar1->Item + lVar13 * 4) = pPVar11;
          (&pFVar1->Amount)[lVar13] = -1;
        }
        pFVar7->ItemCheckNode = local_608;
        pFVar7->Children = (FStrifeDialogueReply *)0x0;
        ParseReplies(&pFVar7->Children,(Response *)(local_4c0 + 0x1c));
      }
      else {
        pFVar7 = (FStrifeDialogueNode *)operator_new(0x50);
        (pFVar7->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
        (pFVar7->ItemCheck).Most = 0;
        (pFVar7->ItemCheck).Count = 0;
        (pFVar7->SpeakerVoice).ID = 0;
        pFVar7->Goodbye = (char *)0x0;
        (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_61c,0x5d0);
        pPVar8 = GetStrifeType(local_61c);
        pFVar7->SpeakerType = pPVar8;
        uVar5 = StrifeDialogues.Count;
        if ((-1 < local_61c) && (iVar12 != local_61c)) {
          if (pPVar8 != (PClassActor *)0x0) {
            local_650.Index =
                 (pPVar8->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
                 Index;
            puVar9 = (uint *)TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::operator[]
                                       (&ClassRoots,&local_650);
            *puVar9 = uVar5;
          }
          uVar5 = StrifeDialogues.Count;
          pNVar10 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::GetNode
                              (&DialogueRoots,local_61c);
          (pNVar10->Pair).Value = uVar5;
          iVar12 = local_61c;
        }
        pcVar6 = ncopystring(local_600);
        pFVar7->Dialogue = pcVar6;
        (pFVar7->Backdrop).texnum = -1;
        if (local_614 == 0) {
          pcVar6 = (char *)0x0;
        }
        else {
          pcVar6 = fullsound;
          mysnprintf(pcVar6,0x10,"svox/voc%u");
        }
        iVar4 = S_FindSound(pcVar6);
        (pFVar7->SpeakerVoice).ID = iVar4;
        local_600[0] = '\0';
        pcVar6 = ncopystring(local_610);
        pFVar7->SpeakerName = pcVar6;
        pPVar8 = GetStrifeType(local_618);
        pPVar8 = dyn_cast<PClassActor>((DObject *)pPVar8);
        pFVar7->DropType = pPVar8;
        TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Resize(&pFVar7->ItemCheck,3);
        pFVar1 = (pFVar7->ItemCheck).Array;
        for (lVar13 = 8; lVar13 != 0x38; lVar13 = lVar13 + 0x10) {
          *(undefined8 *)((long)pFVar1 + lVar13 + -8) = 0;
          *(undefined4 *)((long)&pFVar1->Item + lVar13) = 0xffffffff;
        }
        pFVar7->ItemCheckNode = 0;
        pFVar7->Children = (FStrifeDialogueReply *)0x0;
        ParseReplies(&pFVar7->Children,(Response *)local_4c0);
      }
      local_640 = pFVar7;
      uVar5 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Push
                        (&StrifeDialogues,&local_640);
      local_640->ThisNodeNum = uVar5;
    }
    return true;
  }
LAB_003f4ce1:
  pcVar6 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
  DPrintf(1,"Incorrect data format for conversation script in %s.\n",pcVar6);
  return false;
}

Assistant:

static bool LoadScriptFile(int lumpnum, FileReader *lump, int numnodes, bool include, int type)
{
	int i;
	DWORD prevSpeakerType;
	FStrifeDialogueNode *node;
	char buffer[4];

	lump->Read(buffer, 4);
	lump->Seek(-4, SEEK_CUR);

	// The binary format is so primitive that this check is enough to detect it.
	bool isbinary = (buffer[0] == 0 || buffer[1] == 0 || buffer[2] == 0 || buffer[3] == 0);

	if ((type == 1 && !isbinary) || (type == 2 && isbinary))
	{
		DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
		return false;
	}

	if (!isbinary)
	{
		P_ParseUSDF(lumpnum, lump, numnodes);
	}
	else 
	{
		if (!include)
		{
			LoadScriptFile("SCRIPT00", true, 1);
		}
		if (!(gameinfo.flags & GI_SHAREWARE))
		{
			// Strife scripts are always a multiple of 1516 bytes because each entry
			// is exactly 1516 bytes long.
			if (numnodes % 1516 != 0)
			{
				DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
				return false;
			}
			numnodes /= 1516;
		}
		else
		{
			// And the teaser version has 1488-byte entries.
			if (numnodes % 1488 != 0)
			{
				DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
				return false;
			}
			numnodes /= 1488;
		}

		prevSpeakerType = 0;

		for (i = 0; i < numnodes; ++i)
		{
			if (!(gameinfo.flags & GI_SHAREWARE))
			{
				node = ReadRetailNode (lump, prevSpeakerType);
			}
			else
			{
				node = ReadTeaserNode (lump, prevSpeakerType);
			}
			node->ThisNodeNum = StrifeDialogues.Push(node);
		}
	}
	return true;
}